

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

SampledSpectrum __thiscall
pbrt::Vertex::Le(Vertex *this,
                vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *infiniteLights,
                Vertex *v,SampledWavelengths *lambda)

{
  undefined8 uVar1;
  undefined8 uVar2;
  VertexType VVar3;
  pointer pLVar4;
  ulong uVar5;
  uint uVar6;
  uint *puVar7;
  pointer pLVar8;
  DiffuseAreaLight *this_00;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  SampledSpectrum SVar30;
  Ray local_68;
  Tuple3<pbrt::Vector3,_float> local_40;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar14 [56];
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined1 auVar20 [56];
  
  VVar3 = this->type;
  if (VVar3 != Light) {
    if (VVar3 != Surface) goto LAB_00464050;
    if (((this->field_2).si.areaLight.
         super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
         .bits & 0xffffffffffff) == 0) {
      auVar22._0_4_ = 0.0;
      auVar34._4_4_ = 0.0;
      register0x00001240 = 0.0;
      register0x00001244 = 0.0;
      return (SampledSpectrum)auVar22;
    }
  }
  uVar1 = *(undefined8 *)
           &(v->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  auVar22 = vinsertps_avx(*(undefined1 (*) [16])&v->field_2,
                          ZEXT416((uint)(v->field_2).ei.super_Interaction.pi.
                                        super_Point3<pbrt::Interval<float>_>.
                                        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high),
                          0x10);
  auVar24 = vinsertps_avx(*(undefined1 (*) [16])&this->field_2,
                          ZEXT416((uint)(this->field_2).ei.super_Interaction.pi.
                                        super_Point3<pbrt::Interval<float>_>.
                                        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high),
                          0x10);
  uVar2 = *(undefined8 *)
           &(this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  auVar10._0_4_ = ((float)uVar1 + auVar22._0_4_) * 0.5;
  auVar10._4_4_ = ((float)((ulong)uVar1 >> 0x20) + auVar22._4_4_) * 0.5;
  auVar10._8_4_ = (auVar22._8_4_ + 0.0) * 0.5;
  auVar10._12_4_ = (auVar22._12_4_ + 0.0) * 0.5;
  auVar21._0_4_ = ((float)uVar2 + auVar24._0_4_) * 0.5;
  auVar21._4_4_ = ((float)((ulong)uVar2 >> 0x20) + auVar24._4_4_) * 0.5;
  auVar21._8_4_ = (auVar24._8_4_ + 0.0) * 0.5;
  auVar21._12_4_ = (auVar24._12_4_ + 0.0) * 0.5;
  local_68.o.super_Tuple3<pbrt::Point3,_float>.z =
       ((this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
       (this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
  auVar24 = vsubps_avx(auVar10,auVar21);
  local_40.z = ((v->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
               (v->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5 -
               local_68.o.super_Tuple3<pbrt::Point3,_float>.z;
  auVar15._0_4_ = auVar24._0_4_ * auVar24._0_4_;
  auVar15._4_4_ = auVar24._4_4_ * auVar24._4_4_;
  auVar15._8_4_ = auVar24._8_4_ * auVar24._8_4_;
  auVar15._12_4_ = auVar24._12_4_ * auVar24._12_4_;
  auVar22 = vmovshdup_avx(auVar15);
  auVar22 = vfmadd231ss_fma(auVar22,auVar24,auVar24);
  auVar22 = vfmadd231ss_fma(auVar22,ZEXT416((uint)local_40.z),ZEXT416((uint)local_40.z));
  if ((auVar22._0_4_ != 0.0) || (NAN(auVar22._0_4_))) {
    auVar22 = vsqrtss_avx(auVar22,auVar22);
    fVar25 = auVar22._0_4_;
    auVar26._4_4_ = fVar25;
    auVar26._0_4_ = fVar25;
    auVar26._8_4_ = fVar25;
    auVar26._12_4_ = fVar25;
    local_40.z = local_40.z / fVar25;
    auVar22 = vdivps_avx(auVar24,auVar26);
    local_40._0_8_ = vmovlps_avx(auVar22);
    if ((VVar3 == Light) &&
       ((puVar7 = (uint *)((ulong)(this->field_2).ei.field_0 & 0xffffffffffff),
        puVar7 == (uint *)0x0 || ((*puVar7 & 0xfffffffd) == 1)))) {
      pLVar8 = (infiniteLights->
               super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pLVar4 = (infiniteLights->
               super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (pLVar8 == pLVar4) {
        auVar29._0_4_ = 0.0;
        auVar33._4_4_ = 0.0;
        register0x00001240 = 0.0;
        register0x00001244 = 0.0;
        return (SampledSpectrum)auVar29;
      }
      auVar24._0_8_ = auVar22._0_8_ ^ 0x8000000080000000;
      auVar24._8_4_ = auVar22._8_4_ ^ 0x80000000;
      auVar24._12_4_ = auVar22._12_4_ ^ 0x80000000;
      fVar25 = -local_40.z;
      auVar22 = ZEXT416(0) << 0x20;
      do {
        uVar1 = *(undefined8 *)
                 &(this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
        auVar10 = vinsertps_avx(*(undefined1 (*) [16])&this->field_2,
                                ZEXT416((uint)(this->field_2).ei.super_Interaction.pi.
                                              super_Point3<pbrt::Interval<float>_>.
                                              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.
                                              high),0x10);
        auVar9._0_4_ = ((float)uVar1 + auVar10._0_4_) * 0.5;
        auVar9._4_4_ = ((float)((ulong)uVar1 >> 0x20) + auVar10._4_4_) * 0.5;
        auVar9._8_4_ = (auVar10._8_4_ + 0.0) * 0.5;
        auVar9._12_4_ = (auVar10._12_4_ + 0.0) * 0.5;
        local_68.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar9);
        auVar10 = ZEXT416(0) << 0x20;
        auVar14 = ZEXT456(0);
        local_68.o.super_Tuple3<pbrt::Point3,_float>.z =
             ((this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
             (this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
        local_68.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar24);
        local_68.time = 0.0;
        local_68.medium.
        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
        .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                 )0;
        auVar16._0_12_ = ZEXT812(0);
        auVar16._12_4_ = 0;
        auVar20 = ZEXT456(0);
        uVar5 = (pLVar8->
                super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                ).bits;
        uVar6 = (uint)(ushort)(uVar5 >> 0x30);
        if (6 < uVar6) {
          uVar6 = uVar6 - 6;
          local_68.d.super_Tuple3<pbrt::Vector3,_float>.z = fVar25;
          if (uVar6 < 2) {
            SVar30 = UniformInfiniteLight::Le
                               ((UniformInfiniteLight *)(uVar5 & 0xffffffffffff),&local_68,lambda);
            auVar17._0_8_ = SVar30.values.values._8_8_;
            auVar17._8_56_ = auVar20;
            auVar16 = auVar17._0_16_;
            auVar11._0_8_ = SVar30.values.values._0_8_;
            auVar11._8_56_ = auVar14;
            auVar10 = auVar11._0_16_;
          }
          else if (uVar6 == 2) {
            SVar30 = ImageInfiniteLight::Le
                               ((ImageInfiniteLight *)(uVar5 & 0xffffffffffff),&local_68,lambda);
            auVar18._0_8_ = SVar30.values.values._8_8_;
            auVar18._8_56_ = auVar20;
            auVar16 = auVar18._0_16_;
            auVar12._0_8_ = SVar30.values.values._0_8_;
            auVar12._8_56_ = auVar14;
            auVar10 = auVar12._0_16_;
          }
          else {
            SVar30 = PortalImageInfiniteLight::Le
                               ((PortalImageInfiniteLight *)(uVar5 & 0xffffffffffff),&local_68,
                                lambda);
            auVar19._0_8_ = SVar30.values.values._8_8_;
            auVar19._8_56_ = auVar20;
            auVar16 = auVar19._0_16_;
            auVar13._0_8_ = SVar30.values.values._0_8_;
            auVar13._8_56_ = auVar14;
            auVar10 = auVar13._0_16_;
          }
        }
        auVar10 = vmovlhps_avx(auVar10,auVar16);
        pLVar8 = pLVar8 + 1;
        auVar23._0_4_ = auVar10._0_4_ + auVar22._0_4_;
        auVar23._4_4_ = auVar10._4_4_ + auVar22._4_4_;
        auVar23._8_4_ = auVar10._8_4_ + auVar22._8_4_;
        auVar23._12_4_ = auVar10._12_4_ + auVar22._12_4_;
        auVar22 = auVar23;
      } while (pLVar8 != pLVar4);
      auVar22 = vshufpd_avx(auVar23,auVar23,1);
      auVar28._0_4_ = auVar23._0_4_;
      auVar32._4_4_ = auVar23._4_4_;
      register0x00001240 = (float)auVar22._0_8_;
      register0x00001244 = (float)((ulong)auVar22._0_8_ >> 0x20);
      return (SampledSpectrum)auVar28;
    }
    uVar5 = (this->field_2).si.areaLight.
            super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
            .bits;
    this_00 = (DiffuseAreaLight *)(uVar5 & 0xffffffffffff);
    if (this_00 != (DiffuseAreaLight *)0x0) {
      local_68.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar21);
      if ((this_00->super_LightBase).type != Area) {
        LogFatal<char_const(&)[26]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.h"
                   ,0x34f,"Check failed: %s",(char (*) [26])"Type() == LightType::Area");
      }
      if ((short)(uVar5 >> 0x30) != 6) {
        auVar27._0_4_ = 0.0;
        auVar31._4_4_ = 0.0;
        register0x00001240 = 0.0;
        register0x00001244 = 0.0;
        return (SampledSpectrum)auVar27;
      }
      SVar30 = DiffuseAreaLight::L(this_00,&local_68.o,&(this->field_2).ei.super_Interaction.n,
                                   &(this->field_2).ei.super_Interaction.uv,(Vector3f *)&local_40,
                                   lambda);
      return (SampledSpectrum)(undefined1  [16])SVar30.values.values;
    }
  }
LAB_00464050:
  return (array<float,_4>)(array<float,_4>)(ZEXT816(0) << 0x40);
}

Assistant:

SampledSpectrum Le(const std::vector<LightHandle> &infiniteLights, const Vertex &v,
                       const SampledWavelengths &lambda) const {
        if (!IsLight())
            return SampledSpectrum(0.f);
        Vector3f w = v.p() - p();
        if (LengthSquared(w) == 0)
            return SampledSpectrum(0.);
        w = Normalize(w);
        if (IsInfiniteLight()) {
            // Return emitted radiance for infinite light sources
            SampledSpectrum Le(0.f);
            for (const auto &light : infiniteLights)
                Le += light.Le(Ray(p(), -w), lambda);
            return Le;

        } else {
            return si.areaLight ? si.areaLight.L(si.p(), si.n, si.uv, w, lambda)
                                : SampledSpectrum(0.);
        }
    }